

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,
          int rowPitch,int slicePitch,void *data)

{
  int iVar1;
  
  this->m_format = *format;
  (this->m_size).m_data[0] = width;
  (this->m_size).m_data[1] = height;
  (this->m_size).m_data[2] = depth;
  iVar1 = getPixelSize(*format);
  (this->m_pitch).m_data[0] = iVar1;
  (this->m_pitch).m_data[1] = rowPitch;
  (this->m_pitch).m_data[2] = slicePitch;
  this->m_data = data;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureFormat& format, int width, int height, int depth, int rowPitch, int slicePitch, const void* data)
	: m_format		(format)
	, m_size		(width, height, depth)
	, m_pitch		(format.getPixelSize(), rowPitch, slicePitch)
	, m_data		((void*)data)
{
	DE_ASSERT(isValid(format));
}